

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darRefact.c
# Opt level: O3

int Dar_ManRefactorTryCuts(Ref_Man_t *p,Aig_Obj_t *pObj,int nNodesSaved,int Required)

{
  Vec_Ptr_t *vLeaves;
  Vec_Ptr_t *pVVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  Vec_Vec_t *pVVar6;
  uint *puTruth;
  ulong uVar7;
  ulong uVar8;
  Kit_Graph_t *pKVar9;
  void **ppvVar10;
  Kit_Graph_t *pKVar11;
  long lVar12;
  
  p->GainBest = -1;
  p->pGraphBest = (Kit_Graph_t *)0x0;
  pVVar6 = p->vCuts;
  if (0 < pVVar6->nSize) {
    lVar12 = 0;
    do {
      vLeaves = (Vec_Ptr_t *)pVVar6->pArray[lVar12];
      if (vLeaves->nSize != 0) {
        p->nCutsTried = p->nCutsTried + 1;
        Aig_ObjCollectCut(pObj,vLeaves,p->vCutNodes);
        puTruth = Aig_ManCutTruth(pObj,vLeaves,p->vCutNodes,p->vTruthElem,p->vTruthStore);
        iVar3 = vLeaves->nSize;
        uVar7 = (ulong)(uint)(1 << ((char)iVar3 - 5U & 0x1f));
        uVar8 = uVar7;
        if (iVar3 < 6) {
          uVar7 = 1;
          uVar8 = uVar7;
        }
        do {
          if ((int)uVar7 < 1) {
            iVar3 = Aig_NodeMffcSupp(p->pAig,pObj,0,(Vec_Ptr_t *)0x0);
            p->GainBest = iVar3;
            pKVar9 = Kit_GraphCreateConst0();
            goto LAB_00495eb2;
          }
          lVar2 = uVar7 - 1;
          uVar7 = uVar7 - 1;
        } while (puTruth[lVar2] == 0);
        do {
          if ((int)uVar8 < 1) {
            iVar3 = Aig_NodeMffcSupp(p->pAig,pObj,0,(Vec_Ptr_t *)0x0);
            p->GainBest = iVar3;
            pKVar9 = Kit_GraphCreateConst1();
LAB_00495eb2:
            p->pGraphBest = pKVar9;
            pVVar1 = p->vLeavesBest;
            pVVar1->nSize = 0;
            iVar3 = vLeaves->nSize;
            ppvVar10 = pVVar1->pArray;
            iVar4 = iVar3;
            if (pVVar1->nCap < iVar3) {
              if (ppvVar10 == (void **)0x0) {
                ppvVar10 = (void **)malloc((long)iVar3 << 3);
              }
              else {
                ppvVar10 = (void **)realloc(ppvVar10,(long)iVar3 << 3);
                iVar4 = vLeaves->nSize;
              }
              pVVar1->pArray = ppvVar10;
              pVVar1->nCap = iVar3;
            }
            memcpy(ppvVar10,vLeaves->pArray,(long)iVar4 << 3);
            pVVar1->nSize = vLeaves->nSize;
            goto LAB_00495f20;
          }
          lVar2 = uVar8 - 1;
          uVar8 = uVar8 - 1;
        } while (puTruth[lVar2] == 0xffffffff);
        iVar3 = Kit_TruthIsop(puTruth,iVar3,p->vMemory,0);
        if (-1 < iVar3) {
          pKVar9 = Kit_SopFactor(p->vMemory,0,vLeaves->nSize,p->vMemory);
          iVar3 = Dar_RefactTryGraph(p->pAig,pObj,vLeaves,pKVar9,
                                     nNodesSaved - (uint)(p->pPars->fUseZeros == 0),Required);
          if (iVar3 < 0) {
            Kit_GraphFree(pKVar9);
          }
          else {
            iVar3 = nNodesSaved - iVar3;
            if (p->GainBest < iVar3) {
              pKVar11 = p->pGraphBest;
LAB_00495c1b:
              p->GainBest = iVar3;
              if (pKVar11 != (Kit_Graph_t *)0x0) {
LAB_00495c23:
                Kit_GraphFree(pKVar11);
              }
              p->pGraphBest = pKVar9;
              pVVar1 = p->vLeavesBest;
              pVVar1->nSize = 0;
              iVar3 = vLeaves->nSize;
              ppvVar10 = pVVar1->pArray;
              iVar4 = iVar3;
              if (pVVar1->nCap < iVar3) {
                if (ppvVar10 == (void **)0x0) {
                  ppvVar10 = (void **)malloc((long)iVar3 << 3);
                }
                else {
                  ppvVar10 = (void **)realloc(ppvVar10,(long)iVar3 << 3);
                  iVar4 = vLeaves->nSize;
                }
                pVVar1->pArray = ppvVar10;
                pVVar1->nCap = iVar3;
              }
              memcpy(ppvVar10,vLeaves->pArray,(long)iVar4 << 3);
              pVVar1->nSize = vLeaves->nSize;
            }
            else {
              if (p->GainBest == iVar3) {
                pKVar11 = p->pGraphBest;
                if (pKVar9->fConst != 0) goto LAB_00495c1b;
                if ((*(uint *)&pKVar11->pNodes[(uint)pKVar11->eRoot >> 1 & 0x3fffffff].field_0x10 &
                    0x3fff) <=
                    (*(uint *)&pKVar9->pNodes[(uint)pKVar9->eRoot >> 1 & 0x3fffffff].field_0x10 &
                    0x3fff)) goto LAB_00495cdd;
                p->GainBest = iVar3;
                goto LAB_00495c23;
              }
LAB_00495cdd:
              Kit_GraphFree(pKVar9);
            }
          }
        }
        iVar3 = vLeaves->nSize;
        uVar5 = 1 << ((char)iVar3 - 5U & 0x1f);
        if (iVar3 < 6) {
          uVar5 = 1;
        }
        if (0 < (int)uVar5) {
          uVar7 = (ulong)uVar5 + 1;
          do {
            puTruth[uVar7 - 2] = ~puTruth[uVar7 - 2];
            uVar7 = uVar7 - 1;
          } while (1 < uVar7);
          iVar3 = vLeaves->nSize;
        }
        iVar3 = Kit_TruthIsop(puTruth,iVar3,p->vMemory,0);
        if (-1 < iVar3) {
          pKVar9 = Kit_SopFactor(p->vMemory,1,vLeaves->nSize,p->vMemory);
          iVar3 = Dar_RefactTryGraph(p->pAig,pObj,vLeaves,pKVar9,
                                     nNodesSaved - (uint)(p->pPars->fUseZeros == 0),Required);
          if (iVar3 < 0) {
LAB_00495e57:
            Kit_GraphFree(pKVar9);
          }
          else {
            iVar3 = nNodesSaved - iVar3;
            if (p->GainBest < iVar3) {
              pKVar11 = p->pGraphBest;
LAB_00495d9b:
              p->GainBest = iVar3;
              if (pKVar11 != (Kit_Graph_t *)0x0) goto LAB_00495da3;
            }
            else {
              if (p->GainBest != iVar3) goto LAB_00495e57;
              pKVar11 = p->pGraphBest;
              if (pKVar9->fConst != 0) goto LAB_00495d9b;
              if ((*(uint *)&pKVar11->pNodes[(uint)pKVar11->eRoot >> 1 & 0x3fffffff].field_0x10 &
                  0x3fff) <=
                  (*(uint *)&pKVar9->pNodes[(uint)pKVar9->eRoot >> 1 & 0x3fffffff].field_0x10 &
                  0x3fff)) goto LAB_00495e57;
              p->GainBest = iVar3;
LAB_00495da3:
              Kit_GraphFree(pKVar11);
            }
            p->pGraphBest = pKVar9;
            pVVar1 = p->vLeavesBest;
            pVVar1->nSize = 0;
            iVar3 = vLeaves->nSize;
            ppvVar10 = pVVar1->pArray;
            iVar4 = iVar3;
            if (pVVar1->nCap < iVar3) {
              if (ppvVar10 == (void **)0x0) {
                ppvVar10 = (void **)malloc((long)iVar3 << 3);
              }
              else {
                ppvVar10 = (void **)realloc(ppvVar10,(long)iVar3 << 3);
                iVar4 = vLeaves->nSize;
              }
              pVVar1->pArray = ppvVar10;
              pVVar1->nCap = iVar3;
            }
            memcpy(ppvVar10,vLeaves->pArray,(long)iVar4 << 3);
            pVVar1->nSize = vLeaves->nSize;
          }
        }
      }
      lVar12 = lVar12 + 1;
      pVVar6 = p->vCuts;
    } while (lVar12 < pVVar6->nSize);
  }
LAB_00495f20:
  return p->GainBest;
}

Assistant:

int Dar_ManRefactorTryCuts( Ref_Man_t * p, Aig_Obj_t * pObj, int nNodesSaved, int Required )
{
    Vec_Ptr_t * vCut;
    Kit_Graph_t * pGraphCur;
    int k, RetValue, GainCur, nNodesAdded;
    unsigned * pTruth;

    p->GainBest = -1;
    p->pGraphBest = NULL;
    Vec_VecForEachLevel( p->vCuts, vCut, k )
    {
        if ( Vec_PtrSize(vCut) == 0 )
            continue;
//        if ( Vec_PtrSize(vCut) != 0 && Vec_PtrSize(Vec_VecEntry(p->vCuts, k+1)) != 0 )
//            continue;

        p->nCutsTried++;
        // get the cut nodes
        Aig_ObjCollectCut( pObj, vCut, p->vCutNodes );
        // get the truth table
        pTruth = Aig_ManCutTruth( pObj, vCut, p->vCutNodes, p->vTruthElem, p->vTruthStore );
        if ( Kit_TruthIsConst0(pTruth, Vec_PtrSize(vCut)) )
        {
            p->GainBest = Aig_NodeMffcSupp( p->pAig, pObj, 0, NULL );
            p->pGraphBest = Kit_GraphCreateConst0();
            Vec_PtrCopy( p->vLeavesBest, vCut );
            return p->GainBest;
        }
        if ( Kit_TruthIsConst1(pTruth, Vec_PtrSize(vCut)) )
        {
            p->GainBest = Aig_NodeMffcSupp( p->pAig, pObj, 0, NULL );
            p->pGraphBest = Kit_GraphCreateConst1();
            Vec_PtrCopy( p->vLeavesBest, vCut );
            return p->GainBest;
        }

        // try the positive phase
        RetValue = Kit_TruthIsop( pTruth, Vec_PtrSize(vCut), p->vMemory, 0 );
        if ( RetValue > -1 )
        {
            pGraphCur = Kit_SopFactor( p->vMemory, 0, Vec_PtrSize(vCut), p->vMemory );
/*
{
    int RetValue;
    RetValue = Bdc_ManDecompose( p->pManDec, pTruth, NULL, Vec_PtrSize(vCut), NULL, 1000 );
    printf( "Graph = %d. Bidec = %d.\n", Kit_GraphNodeNum(pGraphCur), RetValue );
}
*/
            nNodesAdded = Dar_RefactTryGraph( p->pAig, pObj, vCut, pGraphCur, nNodesSaved - !p->pPars->fUseZeros, Required );
            if ( nNodesAdded > -1 )
            {
                GainCur = nNodesSaved - nNodesAdded;
                if ( p->GainBest < GainCur || (p->GainBest == GainCur && 
                    (Kit_GraphIsConst(pGraphCur) || Kit_GraphRootLevel(pGraphCur) < Kit_GraphRootLevel(p->pGraphBest))) )
                {
                    p->GainBest = GainCur;
                    if ( p->pGraphBest )
                        Kit_GraphFree( p->pGraphBest );
                    p->pGraphBest = pGraphCur;
                    Vec_PtrCopy( p->vLeavesBest, vCut );
                }
                else
                    Kit_GraphFree( pGraphCur );
            }
            else
                Kit_GraphFree( pGraphCur );
        }
        // try negative phase
        Kit_TruthNot( pTruth, pTruth, Vec_PtrSize(vCut) );
        RetValue = Kit_TruthIsop( pTruth, Vec_PtrSize(vCut), p->vMemory, 0 );
//        Kit_TruthNot( pTruth, pTruth, Vec_PtrSize(vCut) );
        if ( RetValue > -1 )
        {
            pGraphCur = Kit_SopFactor( p->vMemory, 1, Vec_PtrSize(vCut), p->vMemory );
/*
{
    int RetValue;
    RetValue = Bdc_ManDecompose( p->pManDec, pTruth, NULL, Vec_PtrSize(vCut), NULL, 1000 );
    printf( "Graph = %d. Bidec = %d.\n", Kit_GraphNodeNum(pGraphCur), RetValue );
}
*/
            nNodesAdded = Dar_RefactTryGraph( p->pAig, pObj, vCut, pGraphCur, nNodesSaved - !p->pPars->fUseZeros, Required );
            if ( nNodesAdded > -1 )
            {
                GainCur = nNodesSaved - nNodesAdded;
                if ( p->GainBest < GainCur || (p->GainBest == GainCur && 
                    (Kit_GraphIsConst(pGraphCur) || Kit_GraphRootLevel(pGraphCur) < Kit_GraphRootLevel(p->pGraphBest))) )
                {
                    p->GainBest = GainCur;
                    if ( p->pGraphBest )
                        Kit_GraphFree( p->pGraphBest );
                    p->pGraphBest = pGraphCur;
                    Vec_PtrCopy( p->vLeavesBest, vCut );
                }
                else
                    Kit_GraphFree( pGraphCur );
            }
            else
                Kit_GraphFree( pGraphCur );
        }
    }

    return p->GainBest;
}